

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

bool __thiscall Highs::infeasibleBoundsOk(Highs *this)

{
  double *pdVar1;
  double dVar2;
  pointer pHVar3;
  HighsLogOptions *log_options_;
  long lVar4;
  long lVar5;
  pointer pHVar6;
  HighsInt num_true_infeasible_bound;
  HighsInt num_ok_infeasible_bound;
  anon_class_32_4_0faf6aa2 assessInfeasibleBound;
  HighsInt local_a8;
  HighsInt local_a4;
  HighsLogOptions *local_a0;
  pointer local_98;
  anon_class_32_4_0faf6aa2 local_90;
  string local_70;
  string local_50;
  
  local_90.num_true_infeasible_bound = &local_a8;
  local_a0 = &(this->options_).super_HighsOptionsStruct.log_options;
  local_a8 = 0;
  local_90.num_ok_infeasible_bound = &local_a4;
  local_a4 = 0;
  pHVar3 = (this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar6 = (this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_90.this = this;
  local_90.log_options = local_a0;
  if (0 < (this->model_).lp_.num_col_) {
    lVar5 = 0;
    lVar4 = 0;
    local_98 = pHVar6;
    local_90.num_true_infeasible_bound = &local_a8;
    do {
      if ((pHVar6 == pHVar3) ||
         (((this->model_).lp_.integrality_.
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4] & ~kInteger) != kSemiContinuous)) {
        dVar2 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar4];
        pdVar1 = (this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar4;
        if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Column","");
          infeasibleBoundsOk::anon_class_32_4_0faf6aa2::operator()
                    (&local_90,&local_50,(HighsInt)lVar4,
                     (double *)
                     ((long)(this->model_).lp_.col_lower_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar5),
                     (double *)
                     ((long)(this->model_).lp_.col_upper_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar5));
          pHVar6 = local_98;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar4 < (this->model_).lp_.num_col_);
  }
  if (0 < (this->model_).lp_.num_row_) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      dVar2 = (this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar4];
      pdVar1 = (this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar4;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Row","");
        infeasibleBoundsOk::anon_class_32_4_0faf6aa2::operator()
                  (&local_90,&local_70,(HighsInt)lVar4,
                   (double *)
                   ((long)(this->model_).lp_.row_lower_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar5),
                   (double *)
                   ((long)(this->model_).lp_.row_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar5));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar4 < (this->model_).lp_.num_row_);
  }
  log_options_ = local_a0;
  if (0 < local_a4) {
    highsLogUser(local_a0,kInfo,"Model has %d small inconsistent bound(s): rectified\n");
  }
  if (0 < local_a8) {
    highsLogUser(log_options_,kInfo,"Model has %d significant inconsistent bound(s): infeasible\n");
  }
  return local_a8 == 0;
}

Assistant:

bool Highs::infeasibleBoundsOk() {
  const HighsLogOptions& log_options = this->options_.log_options;
  HighsLp& lp = this->model_.lp_;

  HighsInt num_true_infeasible_bound = 0;
  HighsInt num_ok_infeasible_bound = 0;
  const bool has_integrality = lp.integrality_.size() > 0;
  // Lambda for assessing infeasible bounds
  auto assessInfeasibleBound = [&](const std::string type, const HighsInt iX,
                                   double& lower, double& upper) {
    double range = upper - lower;
    if (range >= 0) return true;
    if (range > -this->options_.primal_feasibility_tolerance) {
      num_ok_infeasible_bound++;
      bool report = num_ok_infeasible_bound <= 10;
      bool integer_lower = lower == std::floor(lower + 0.5);
      bool integer_upper = upper == std::floor(upper + 0.5);
      assert(!integer_lower || !integer_upper);
      if (integer_lower) {
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "upper bound to %g\n",
                       type.c_str(), int(iX), lower, upper, range, lower);
        upper = lower;
      } else if (integer_upper) {
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "lower bound to %g\n",
                       type.c_str(), int(iX), lower, upper, range, upper);
        lower = upper;
      } else {
        double mid = 0.5 * (lower + upper);
        if (report)
          highsLogUser(log_options, HighsLogType::kInfo,
                       "%s %d bounds [%g, %g] have infeasibility = %g so set "
                       "both bounds to %g\n",
                       type.c_str(), int(iX), lower, upper, range, mid);
        lower = mid;
        upper = mid;
      }
      return true;
    }
    num_true_infeasible_bound++;
    if (num_true_infeasible_bound <= 10)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "%s %d bounds [%g, %g] have excessive infeasibility = %g\n",
                   type.c_str(), int(iX), lower, upper, range);
    return false;
  };

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (has_integrality) {
      // Semi-variables can have inconsistent bounds
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
          lp.integrality_[iCol] == HighsVarType::kSemiInteger)
        continue;
    }
    if (lp.col_lower_[iCol] > lp.col_upper_[iCol])
      assessInfeasibleBound("Column", iCol, lp.col_lower_[iCol],
                            lp.col_upper_[iCol]);
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lp.row_lower_[iRow] > lp.row_upper_[iRow])
      assessInfeasibleBound("Row", iRow, lp.row_lower_[iRow],
                            lp.row_upper_[iRow]);
  }
  if (num_ok_infeasible_bound > 0)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Model has %d small inconsistent bound(s): rectified\n",
                 int(num_ok_infeasible_bound));
  if (num_true_infeasible_bound > 0)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Model has %d significant inconsistent bound(s): infeasible\n",
                 int(num_true_infeasible_bound));
  return num_true_infeasible_bound == 0;
}